

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

int __thiscall
absl::lts_20250127::time_internal::cctz::anon_unknown_0::FileZoneInfoSource::Skip
          (FileZoneInfoSource *this,size_t offset)

{
  int iVar1;
  unsigned_long *puVar2;
  FILE *__stream;
  unsigned_long uStack_18;
  int rc;
  size_t offset_local;
  FileZoneInfoSource *this_local;
  
  uStack_18 = offset;
  offset_local = (size_t)this;
  puVar2 = std::min<unsigned_long>(&stack0xffffffffffffffe8,&this->len_);
  uStack_18 = *puVar2;
  __stream = (FILE *)std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::get(&this->fp_);
  iVar1 = fseek(__stream,uStack_18,1);
  if (iVar1 == 0) {
    this->len_ = this->len_ - uStack_18;
  }
  return iVar1;
}

Assistant:

int Skip(std::size_t offset) override {
    offset = std::min(offset, len_);
    int rc = fseek(fp_.get(), static_cast<long>(offset), SEEK_CUR);
    if (rc == 0) len_ -= offset;
    return rc;
  }